

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::commands::show_help(commands *this)

{
  status_t sVar1;
  token *ptVar2;
  undefined8 *puVar3;
  int iVar4;
  uint uVar5;
  _Self __tmp_1;
  debug *this_00;
  _Rb_tree_node_base *p_Var6;
  undefined8 uVar7;
  char cVar8;
  char *__s;
  _Self __tmp;
  token **pptVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  size_type *local_70;
  string cmd_str_search;
  command_list_t match;
  command *cmd;
  
  puts("?");
  sVar1 = this->status;
  if (sVar1 < TERMINATED) {
    if ((0xf1U >> (sVar1 & 0x1f) & 1) == 0) {
      if ((10U >> (sVar1 & 0x1f) & 1) == 0) {
        __s = "No known commands match current line";
      }
      else {
        if (this->cmd == (command *)0x0) {
          local_70 = &cmd_str_search._M_string_length;
          cmd_str_search._M_dataplus._M_p = (pointer)0x0;
          cmd_str_search._M_string_length._0_1_ = 0;
          pptVar9 = &this->t_cmd;
          while ((ptVar2 = *pptVar9, ptVar2 != (token *)0x0 && (ptVar2->length != 0))) {
            this_00 = debug::initialize(0);
            debug::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            cVar8 = (char)(string *)&local_70;
            if (cmd_str_search._M_dataplus._M_p != (pointer)0x0) {
              std::__cxx11::string::push_back(cVar8);
            }
            std::__cxx11::string::append((string *)&local_70);
            pptVar9 = &ptVar2->next;
            if ((ptVar2->next == (token *)0x0) &&
               (ptVar2->length + ptVar2->offset < (this->super_edit_object).insert_idx)) {
              std::__cxx11::string::push_back(cVar8);
            }
          }
          cmd_str_search.field_2._8_8_ = (long)&cmd_str_search.field_2 + 8;
          match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>._M_impl.
          _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
          uVar11 = 0;
          p_Var10 = (this->C_sorted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)cmd_str_search.field_2._8_8_;
          while (uVar7 = cmd_str_search.field_2._8_8_,
                (_Rb_tree_header *)p_Var10 != &(this->C_sorted)._M_t._M_impl.super__Rb_tree_header)
          {
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
            match.super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>.
            _M_impl._M_node._M_size = *(size_t *)(p_Var10 + 1);
            p_Var10 = p_Var6;
            if ((((*(ulong *)(match.
                              super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                              ._M_impl._M_node._M_size + 0x80) & this->mask) != 0) &&
                (*(char *)(match.
                           super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                           ._M_impl._M_node._M_size + 0x88) == '\0')) &&
               ((cmd_str_search._M_dataplus._M_p == (pointer)0x0 ||
                (iVar4 = std::__cxx11::string::compare
                                   (match.
                                    super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                                    ._M_impl._M_node._M_size + 0x28,0,
                                    (string *)cmd_str_search._M_dataplus._M_p), iVar4 == 0)))) {
              std::__cxx11::list<libchars::command_*,_std::allocator<libchars::command_*>_>::
              push_back((list<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                        ((long)&cmd_str_search.field_2 + 8),
                        (value_type *)
                        &match.
                         super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                         ._M_impl._M_node._M_size);
              uVar5 = (uint)*(ulong *)(match.
                                       super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                                       ._M_impl._M_node._M_size + 0x30);
              if (*(ulong *)(match.
                             super__List_base<libchars::command_*,_std::allocator<libchars::command_*>_>
                             ._M_impl._M_node._M_size + 0x30) <= uVar11) {
                uVar5 = (uint)uVar11;
              }
              uVar11 = (ulong)uVar5;
            }
          }
          while ((undefined8 *)uVar7 != (undefined8 *)((long)&cmd_str_search.field_2 + 8)) {
            puVar3 = *(undefined8 **)uVar7;
            printf("%-*s : %s\n",uVar11,*(undefined8 *)(*(long *)(uVar7 + 0x10) + 0x28),
                   *(undefined8 *)(*(long *)(uVar7 + 0x10) + 0x48));
            uVar7 = puVar3;
          }
          std::__cxx11::_List_base<libchars::command_*,_std::allocator<libchars::command_*>_>::
          _M_clear((_List_base<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                   ((long)&cmd_str_search.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_70);
          goto LAB_00111335;
        }
        __s = "** INTERNAL ERROR: partial command **";
      }
      puts(__s);
    }
    else {
      show_parameters(this);
    }
  }
LAB_00111335:
  (this->super_edit_object).cursor = 0;
  (this->super_edit_object).prompt_rendered = 0;
  return;
}

Assistant:

void commands::show_help()
    {
        printf("?\n");

        //TODO: use terminal driver to print strings
        //TODO: pretty-print (e.g. start help in same column)

        switch (status) {
        case TERMINATED:
        case TIMEOUT:
        case FORCED_RETURN:
            // ignore
            break;
        case VALID_COMMAND:
        case MISSING_VALUE:
        case INVALID_ARG:
        case TOO_FEW_ARGS:
        case TOO_MANY_ARGS:
            // command known --> dump parameter help
            show_parameters();
            break;
        case NO_COMMAND:
            // invalid command --> cannot show help
            printf("No known commands match current line\n");
            break;
        case EMPTY:
        case PARTIAL_COMMAND:
            // empty / partially known --> find list of commands that match partial string
            if (cmd != NULL) {
                printf("** INTERNAL ERROR: partial command **\n");
            }
            else {
                std::string cmd_str_search;
                token *T = t_cmd;
                while (T != NULL && T->length > 0) {
                    LC_LOG_VERBOSE("search token [%p/%s@%zu+%zu]",T,T->value.c_str(),T->offset,T->length);
                    if (!cmd_str_search.empty())
                        cmd_str_search += ' ';
                    cmd_str_search.append(T->value);
                    if (T->next == NULL && insert_idx > (T->offset + T->length))
                        cmd_str_search += ' ';
                    T = T->next;
                }
                // build match list
                typedef std::list<command*> command_list_t;
                command_list_t match;
                unsigned int match_max_length = 0;
                command_sorted_list_t::const_iterator ci = C_sorted.begin();
                while (ci != C_sorted.end()) {
                    command *cmd = *ci++;
                    if ((cmd->mask & mask) != 0 && !cmd->hidden && (cmd_str_search.empty() || cmd->cmd_str.compare(0,cmd_str_search.length(),cmd_str_search) == 0)) {
                        match.push_back(cmd);
                        if (cmd->cmd_str.length() > match_max_length)
                            match_max_length = cmd->cmd_str.length();
                    }
                }
                // dump match list
                command_list_t::const_iterator mi = match.begin();
                while (mi != match.end()) {
                    const command *cmd = *mi++;
                    printf("%-*s : %s\n", match_max_length, cmd->cmd_str.c_str(), cmd->help.c_str());
                }
            }
            break;
        }

        rewind();
    }